

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  mixed_channel_t c;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  float x;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_109;
  float local_108;
  float fStack_104;
  float local_100;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  byte local_d8 [48];
  uint local_a8 [36];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [56];
  
  local_f4 = source->min_distance;
  fVar14 = source->max_distance;
  fVar12 = source->location[0] - data->location[0];
  auVar18 = ZEXT432((uint)fVar12);
  fVar13 = source->location[1] - data->location[1];
  fVar21 = source->location[2] - data->location[2];
  auVar10 = ZEXT416((uint)(fVar21 * fVar21 + fVar12 * fVar12 + fVar13 * fVar13));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  auVar10 = vminss_avx(auVar10,ZEXT416((uint)fVar14));
  local_f8 = auVar10._0_4_;
  auVar10 = SUB6416(ZEXT464(0x3f800000),0);
  if ((local_f4 < local_f8) && (local_f4 < fVar14)) {
    local_e8._0_4_ = fVar12;
    local_f0 = fVar13;
    local_ec = fVar21;
    auVar11._0_4_ = (*data->attenuation)(local_f4,fVar14,local_f8,source->rolloff);
    auVar11._4_4_ = extraout_XMM0_Db;
    auVar11._8_56_ = extraout_var;
    auVar10 = auVar11._0_16_;
    auVar18 = ZEXT432((uint)local_e8._0_4_);
    fVar13 = local_f0;
    fVar21 = local_ec;
  }
  local_e8 = auVar10;
  if (source->spatial == true) {
    fVar14 = auVar18._0_4_;
    local_108 = fVar21 * data->look_at[2] + fVar14 * data->look_at[0] + fVar13 * data->look_at[1];
    fStack_104 = fVar21 * data->look_at[5] + fVar14 * data->look_at[3] + fVar13 * data->look_at[4];
    local_100 = fVar21 * data->look_at[8] + fVar14 * data->look_at[6] + fVar13 * data->look_at[7];
    if (local_f8 < local_f4) {
      fVar14 = 1.0 - local_f8 / local_f4;
      auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar14 + fVar14)));
      fVar13 = auVar10._0_4_;
      fVar12 = 1.0 - fVar13;
      fVar14 = fVar13 * 0.0;
      auVar18 = ZEXT432((uint)fVar14);
      local_108 = local_108 * fVar12 + fVar14;
      fStack_104 = fStack_104 * fVar12 + fVar14;
      local_100 = local_100 * fVar12 + fVar13;
    }
    mixed_compute_gains_resolver(&local_108,local_a8,local_d8,&local_109,&data->vbap);
    uVar8 = (ulong)local_109;
    uVar5 = (uint)local_109;
    if (uVar8 != 0) {
      lVar7 = uVar8 - 1;
      auVar17._8_8_ = lVar7;
      auVar17._0_8_ = lVar7;
      auVar17._16_8_ = lVar7;
      auVar17._24_8_ = lVar7;
      uVar6 = 0;
      auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar25._8_8_ = 0x8000000000000000;
      auVar25._0_8_ = 0x8000000000000000;
      auVar25._16_8_ = 0x8000000000000000;
      auVar25._24_8_ = 0x8000000000000000;
      auVar18 = vpcmpeqd_avx2(auVar18,auVar18);
      auVar19._8_4_ = 0x3f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._12_4_ = 0x3f800000;
      auVar19._16_4_ = 0x3f800000;
      auVar19._20_4_ = 0x3f800000;
      auVar19._24_4_ = 0x3f800000;
      auVar19._28_4_ = 0x3f800000;
      do {
        auVar22._8_8_ = uVar6;
        auVar22._0_8_ = uVar6;
        auVar22._16_8_ = uVar6;
        auVar22._24_8_ = uVar6;
        auVar23 = vpor_avx2(auVar22,auVar1);
        auVar15 = vpor_avx2(auVar22,auVar2);
        auVar15 = vpcmpgtq_avx2(auVar15 ^ auVar25,auVar17 ^ auVar25);
        auVar23 = vpcmpgtq_avx2(auVar23 ^ auVar25,auVar17 ^ auVar25);
        auVar15 = vpackssdw_avx2(auVar23,auVar15);
        auVar10 = vpackssdw_avx(SUB3216(auVar15 ^ auVar18,0),SUB3216(auVar15 ^ auVar18,0x10));
        auVar10 = vpshufd_avx(auVar10,0xd8);
        auVar15 = vpmovzxwd_avx2(auVar10);
        auVar23 = vpslld_avx2(auVar15,0x1f);
        auVar15 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_a8 + uVar6));
        auVar4._4_4_ = auVar15._4_4_ * (float)local_e8._0_4_;
        auVar4._0_4_ = auVar15._0_4_ * (float)local_e8._0_4_;
        auVar4._8_4_ = auVar15._8_4_ * (float)local_e8._0_4_;
        auVar4._12_4_ = auVar15._12_4_ * (float)local_e8._0_4_;
        auVar4._16_4_ = auVar15._16_4_ * (float)local_e8._0_4_;
        auVar4._20_4_ = auVar15._20_4_ * (float)local_e8._0_4_;
        auVar4._24_4_ = auVar15._24_4_ * (float)local_e8._0_4_;
        auVar4._28_4_ = auVar15._28_4_;
        auVar15 = vminps_avx(auVar19,auVar4);
        auVar15 = vmaskmovps_avx(auVar23,auVar15);
        *(undefined1 (*) [32])(local_a8 + uVar6) = auVar15;
        uVar6 = uVar6 + 8;
      } while ((local_109 + 7 & 0xfffffff8) != uVar6);
    }
    if ((local_f4 < local_f8) && (data->surround == false)) {
      auVar10 = ZEXT416((uint)(local_100 * local_100 +
                              local_108 * local_108 + fStack_104 * fStack_104));
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar14 = auVar10._0_4_;
      auVar16._0_4_ = local_100 / fVar14;
      auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
      if (0.0 < fVar14) {
        fVar12 = local_108 / fVar14;
      }
      else {
        fVar12 = 0.0;
      }
      auVar10 = vcmpss_avx(ZEXT816(0),auVar10,1);
      auVar10 = vandps_avx(auVar10,auVar16);
      if (0.0 < fVar14) {
        fVar14 = (fStack_104 / fVar14) * 0.0;
      }
      else {
        fVar14 = 0.0;
      }
      if (local_109 != 0 && auVar10._0_4_ + fVar12 * 0.0 + fVar14 < 0.0) {
        uVar6 = 0;
        do {
          uVar9 = (ulong)(data->channels).positions[local_d8[uVar6]];
          if ((uVar9 < 0x21) && ((0x122020202U >> (uVar9 & 0x3f) & 1) != 0)) {
            local_a8[uVar6] = local_a8[uVar6] ^ 0x80000000;
          }
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else {
    local_108 = 0.0;
    fStack_104 = 0.0;
    local_100 = 0.0;
    mixed_compute_gains_resolver(&local_108,local_a8,local_d8,&local_109,&data->vbap);
    uVar5 = (uint)local_109;
    if ((ulong)local_109 == 0) {
      uVar5 = 0;
    }
    else {
      lVar7 = (ulong)local_109 - 1;
      auVar23._8_8_ = lVar7;
      auVar23._0_8_ = lVar7;
      auVar23._16_8_ = lVar7;
      auVar23._24_8_ = lVar7;
      uVar8 = 0;
      auVar1 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar15._8_8_ = 0x8000000000000000;
      auVar15._0_8_ = 0x8000000000000000;
      auVar15._16_8_ = 0x8000000000000000;
      auVar15._24_8_ = 0x8000000000000000;
      auVar18 = vpcmpeqd_avx2(auVar18,auVar18);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20._16_4_ = 0x3f800000;
      auVar20._20_4_ = 0x3f800000;
      auVar20._24_4_ = 0x3f800000;
      auVar20._28_4_ = 0x3f800000;
      do {
        auVar24._8_8_ = uVar8;
        auVar24._0_8_ = uVar8;
        auVar24._16_8_ = uVar8;
        auVar24._24_8_ = uVar8;
        auVar3 = vpor_avx2(auVar24,auVar1);
        auVar24 = vpor_avx2(auVar24,auVar2);
        auVar24 = vpcmpgtq_avx2(auVar24 ^ auVar15,auVar23 ^ auVar15);
        auVar3 = vpcmpgtq_avx2(auVar3 ^ auVar15,auVar23 ^ auVar15);
        auVar24 = vpackssdw_avx2(auVar3,auVar24);
        auVar10 = vpackssdw_avx(SUB3216(auVar24 ^ auVar18,0),SUB3216(auVar24 ^ auVar18,0x10));
        auVar10 = vpshufd_avx(auVar10,0xd8);
        auVar24 = vpmovzxwd_avx2(auVar10);
        auVar25 = vpslld_avx2(auVar24,0x1f);
        auVar24 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])(local_a8 + uVar8));
        auVar3._4_4_ = auVar24._4_4_ * (float)local_e8._0_4_;
        auVar3._0_4_ = auVar24._0_4_ * (float)local_e8._0_4_;
        auVar3._8_4_ = auVar24._8_4_ * (float)local_e8._0_4_;
        auVar3._12_4_ = auVar24._12_4_ * (float)local_e8._0_4_;
        auVar3._16_4_ = auVar24._16_4_ * (float)local_e8._0_4_;
        auVar3._20_4_ = auVar24._20_4_ * (float)local_e8._0_4_;
        auVar3._24_4_ = auVar24._24_4_ * (float)local_e8._0_4_;
        auVar3._28_4_ = auVar24._28_4_;
        auVar24 = vminps_avx(auVar20,auVar3);
        auVar24 = vmaskmovps_avx(auVar25,auVar24);
        *(undefined1 (*) [32])(local_a8 + uVar8) = auVar24;
        uVar8 = uVar8 + 8;
      } while ((local_109 + 7 & 0xfffffff8) != uVar8);
    }
  }
  memcpy(source->volumes,local_a8,(ulong)(uVar5 * 4));
  memcpy(source->speakers,local_d8,(ulong)(uVar5 * 4));
  source->speaker_count = (mixed_channel_t)uVar5;
  return;
}

Assistant:

VECTORIZE static void calculate_volumes(struct space_source *source, struct space_mixer_data *data){
  float volumes[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speakers[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speaker_count;
  float forward[3] = {0.0, 0.0, 1.0};
  float min = source->min_distance;
  float max = source->max_distance;
  float roll = source->rolloff;
  // Relative location to our listener
  float location[3] = {source->location[0]-data->location[0],
                       source->location[1]-data->location[1],
                       source->location[2]-data->location[2]};
  float distance = MIN(vec_length(location), max);
  float volume = 1.0;
  if(min < distance && min < max){
    volume *= data->attenuation(min, max, distance, roll);
  }
  if(source->spatial){
    // Bring the location into our reference frame
    vec_mul(location, data->look_at, location);
    // If we are below min distance, bend towards forward
    if(distance < min){
      vec_lerp(location, location, forward, MIN(1.0, (1-distance/min)*2));
    }
    // Compute the actual gain factors using VBAP
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
    // If we are not on a surround setup, we can simulate the sound appearing
    // from behind by inverting the right channels, causing a phase shift.
    // Only do this when the sound is far enough away though as otherwise it
    // can lead to frequent fluctuations, which sound very... bad.
    if(!data->surround && min < distance && calculate_phase(location) < 0){
      for(mixed_channel_t c=0; c<speaker_count; ++c){
        switch(data->channels.positions[speakers[c]]){
        case MIXED_RIGHT_FRONT_BOTTOM:
        case MIXED_RIGHT_FRONT_TOP:
        case MIXED_RIGHT_FRONT_WIDE:
        case MIXED_RIGHT_FRONT_HIGH:
        case MIXED_RIGHT_CENTER_BOTTOM:
        case MIXED_RIGHT_FRONT_CENTER_BOTTOM:
          volumes[c] *= -1.0;
        }
      }
    }
  }else{
    location[0] = 0.0;
    location[1] = 0.0;
    location[2] = 0.0;
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
  }
  // Cache
  memcpy(source->volumes, volumes, sizeof(float)*speaker_count);
  memcpy(source->speakers, speakers, sizeof(float)*speaker_count);
  source->speaker_count = speaker_count;
}